

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVarLengthArray<QLocaleId,_6LL>::push_back(QVarLengthArray<QLocaleId,_6LL> *this,QLocaleId *t)

{
  QLocaleId *in_RDI;
  QVarLengthArray<QLocaleId,_6LL> *unaff_retaddr;
  
  append(unaff_retaddr,in_RDI);
  return;
}

Assistant:

inline void push_back(const T &t) { append(t); }